

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_function.hpp
# Opt level: O2

scalar_function_t * __thiscall
duckdb::ScalarFunction::GetScalarUnaryFunctionFixedReturn<signed_char,duckdb::SignOperator>
          (scalar_function_t *__return_storage_ptr__,ScalarFunction *this,LogicalType *type)

{
  char cVar1;
  InternalException *this_00;
  allocator local_41;
  string local_40;
  
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  cVar1 = *(char *)&(this->super_BaseScalarFunction).super_SimpleFunction.super_Function.
                    _vptr_Function;
  switch(cVar1) {
  case '\v':
    local_40._M_dataplus._M_p = (pointer)UnaryFunction<signed_char,signed_char,duckdb::SignOperator>
    ;
    break;
  case '\f':
    local_40._M_dataplus._M_p = (pointer)UnaryFunction<short,signed_char,duckdb::SignOperator>;
    break;
  case '\r':
    local_40._M_dataplus._M_p = (pointer)UnaryFunction<int,signed_char,duckdb::SignOperator>;
    break;
  case '\x0e':
    local_40._M_dataplus._M_p = (pointer)UnaryFunction<long,signed_char,duckdb::SignOperator>;
    break;
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x14':
  case '\x15':
  case '\x18':
  case '\x19':
  case '\x1a':
  case '\x1b':
switchD_01d25d68_caseD_f:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_40,"Unimplemented type for GetScalarUnaryFunctionFixedReturn",
               &local_41);
    InternalException::InternalException(this_00,&local_40);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case '\x16':
    local_40._M_dataplus._M_p = (pointer)UnaryFunction<float,signed_char,duckdb::SignOperator>;
    break;
  case '\x17':
    local_40._M_dataplus._M_p = (pointer)UnaryFunction<double,signed_char,duckdb::SignOperator>;
    break;
  case '\x1c':
    local_40._M_dataplus._M_p =
         (pointer)UnaryFunction<unsigned_char,signed_char,duckdb::SignOperator>;
    break;
  case '\x1d':
    local_40._M_dataplus._M_p =
         (pointer)UnaryFunction<unsigned_short,signed_char,duckdb::SignOperator>;
    break;
  case '\x1e':
    local_40._M_dataplus._M_p =
         (pointer)UnaryFunction<unsigned_int,signed_char,duckdb::SignOperator>;
    break;
  case '\x1f':
    local_40._M_dataplus._M_p =
         (pointer)UnaryFunction<unsigned_long,signed_char,duckdb::SignOperator>;
    break;
  default:
    if (cVar1 == '1') {
      local_40._M_dataplus._M_p =
           (pointer)UnaryFunction<duckdb::uhugeint_t,signed_char,duckdb::SignOperator>;
    }
    else {
      if (cVar1 != '2') goto switchD_01d25d68_caseD_f;
      local_40._M_dataplus._M_p =
           (pointer)UnaryFunction<duckdb::hugeint_t,signed_char,duckdb::SignOperator>;
    }
  }
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
            ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
             __return_storage_ptr__,
             (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)&local_40);
  return __return_storage_ptr__;
}

Assistant:

static scalar_function_t GetScalarUnaryFunctionFixedReturn(const LogicalType &type) {
		scalar_function_t function;
		switch (type.id()) {
		case LogicalTypeId::TINYINT:
			function = &ScalarFunction::UnaryFunction<int8_t, TR, OP>;
			break;
		case LogicalTypeId::SMALLINT:
			function = &ScalarFunction::UnaryFunction<int16_t, TR, OP>;
			break;
		case LogicalTypeId::INTEGER:
			function = &ScalarFunction::UnaryFunction<int32_t, TR, OP>;
			break;
		case LogicalTypeId::BIGINT:
			function = &ScalarFunction::UnaryFunction<int64_t, TR, OP>;
			break;
		case LogicalTypeId::UTINYINT:
			function = &ScalarFunction::UnaryFunction<uint8_t, TR, OP>;
			break;
		case LogicalTypeId::USMALLINT:
			function = &ScalarFunction::UnaryFunction<uint16_t, TR, OP>;
			break;
		case LogicalTypeId::UINTEGER:
			function = &ScalarFunction::UnaryFunction<uint32_t, TR, OP>;
			break;
		case LogicalTypeId::UBIGINT:
			function = &ScalarFunction::UnaryFunction<uint64_t, TR, OP>;
			break;
		case LogicalTypeId::HUGEINT:
			function = &ScalarFunction::UnaryFunction<hugeint_t, TR, OP>;
			break;
		case LogicalTypeId::UHUGEINT:
			function = &ScalarFunction::UnaryFunction<uhugeint_t, TR, OP>;
			break;
		case LogicalTypeId::FLOAT:
			function = &ScalarFunction::UnaryFunction<float, TR, OP>;
			break;
		case LogicalTypeId::DOUBLE:
			function = &ScalarFunction::UnaryFunction<double, TR, OP>;
			break;
		default:
			throw InternalException("Unimplemented type for GetScalarUnaryFunctionFixedReturn");
		}
		return function;
	}